

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimTolerance(ON_Brep *this,ON_BrepTrim *trim,bool bLazy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ON_BrepLoop *pOVar7;
  int *piVar8;
  ON_BrepTrim *this_00;
  ON_BrepTrim *this_01;
  ON_Curve *pOVar9;
  ON_Curve *pOVar10;
  ON_Curve *pOVar11;
  double *pdVar12;
  bool local_119;
  double local_118;
  double local_110;
  undefined1 local_e0 [8];
  ON_3dPoint next_start;
  ON_3dPoint this_end;
  ON_3dPoint this_start;
  ON_3dPoint prev_end;
  ON_Curve *c2;
  ON_Curve *next_c2;
  ON_Curve *prev_c2;
  ON_BrepTrim *next_trim;
  ON_BrepTrim *prev_trim;
  int loop_trim_count;
  ON_BrepLoop *loop;
  int next_ti;
  int prev_ti;
  int lti;
  int dir;
  double d;
  double de;
  double ds;
  bool bLazy_local;
  ON_BrepTrim *trim_local;
  ON_Brep *this_local;
  
  if ((((trim->m_tolerance[0] <= 0.0 && trim->m_tolerance[0] != 0.0) ||
       (trim->m_tolerance[1] <= 0.0 && trim->m_tolerance[1] != 0.0)) || (!bLazy)) &&
     ((-1 < trim->m_li &&
      (iVar5 = trim->m_li,
      iVar4 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
      iVar5 < iVar4)))) {
    pOVar7 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,trim->m_li);
    iVar5 = ON_SimpleArray<int>::Count(&pOVar7->m_ti);
    for (next_ti = 0; next_ti < iVar5; next_ti = next_ti + 1) {
      piVar8 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,next_ti);
      if (*piVar8 == trim->m_trim_index) {
        piVar8 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,(next_ti + -1 + iVar5) % iVar5);
        iVar4 = *piVar8;
        piVar8 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,(next_ti + 1) % iVar5);
        iVar5 = *piVar8;
        if (((-1 < iVar4) && (-1 < iVar5)) &&
           ((iVar6 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
            iVar4 < iVar6 &&
            (iVar6 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
            iVar5 < iVar6)))) {
          this_00 = ON_ClassArray<ON_BrepTrim>::operator[]
                              ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,iVar4);
          this_01 = ON_ClassArray<ON_BrepTrim>::operator[]
                              ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,iVar5);
          pOVar9 = ON_BrepTrim::TrimCurveOf(this_00);
          pOVar10 = ON_BrepTrim::TrimCurveOf(this_01);
          pOVar11 = ON_BrepTrim::TrimCurveOf(trim);
          if (((pOVar9 != (ON_Curve *)0x0) && (pOVar11 != (ON_Curve *)0x0)) &&
             (pOVar10 != (ON_Curve *)0x0)) {
            ON_Curve::PointAtEnd((ON_3dPoint *)&this_start.z,(ON_Curve *)this_00);
            ON_Curve::PointAtStart((ON_3dPoint *)&this_end.z,(ON_Curve *)trim);
            ON_Curve::PointAtEnd((ON_3dPoint *)&next_start.z,(ON_Curve *)trim);
            ON_Curve::PointAtStart((ON_3dPoint *)local_e0,(ON_Curve *)this_01);
            for (prev_ti = 0; prev_ti < 2; prev_ti = prev_ti + 1) {
              if ((trim->m_tolerance[prev_ti] <= 0.0 && trim->m_tolerance[prev_ti] != 0.0) ||
                 (!bLazy)) {
                pdVar12 = ON_3dPoint::operator[]((ON_3dPoint *)&this_start.z,prev_ti);
                dVar1 = *pdVar12;
                pdVar12 = ON_3dPoint::operator[]((ON_3dPoint *)&this_end.z,prev_ti);
                dVar2 = *pdVar12;
                pdVar12 = ON_3dPoint::operator[]((ON_3dPoint *)&next_start.z,prev_ti);
                dVar3 = *pdVar12;
                pdVar12 = ON_3dPoint::operator[]((ON_3dPoint *)local_e0,prev_ti);
                local_110 = ABS(dVar3 - *pdVar12);
                if (local_110 <= ABS(dVar1 - dVar2)) {
                  local_110 = ABS(dVar1 - dVar2);
                }
                if (local_110 <= 2.3283064365386963e-10) {
                  local_118 = 0.0;
                }
                else {
                  local_118 = local_110 * 1.001;
                }
                trim->m_tolerance[prev_ti] = local_118;
              }
            }
          }
        }
        break;
      }
    }
  }
  local_119 = false;
  if (0.0 <= trim->m_tolerance[0]) {
    local_119 = 0.0 <= trim->m_tolerance[1];
  }
  return (bool)(-local_119 & 1);
}

Assistant:

bool
ON_Brep::SetTrimTolerance( ON_BrepTrim& trim, bool bLazy ) const
{
  // The TL_Brep::SetTrimTolerance override of this virtual function
  // sets ON_BrepTrim::m_tolerance[] correctly.
  double ds, de, d;
  int dir, lti, prev_ti, next_ti;
  if ( trim.m_tolerance[0] < 0.0 || trim.m_tolerance[1] < 0.0 || !bLazy )
  {
    // set trim tolerance
    if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const int loop_trim_count = loop.m_ti.Count();
      for ( lti = 0; lti < loop_trim_count; lti++ )
      {
        if ( loop.m_ti[lti] == trim.m_trim_index )
        {
          prev_ti = loop.m_ti[(lti-1+loop_trim_count)%loop_trim_count];
          next_ti = loop.m_ti[(lti+1)%loop_trim_count];
          if ( prev_ti >= 0 && next_ti >= 0 && prev_ti < m_T.Count() && next_ti < m_T.Count() )
          {
            const ON_BrepTrim& prev_trim = m_T[prev_ti];
            const ON_BrepTrim& next_trim = m_T[next_ti];
            const ON_Curve* prev_c2 = prev_trim.TrimCurveOf();
            const ON_Curve* next_c2 = next_trim.TrimCurveOf();
            const ON_Curve* c2 = trim.TrimCurveOf();
            if ( prev_c2 && c2 && next_c2 )
            {
              ON_3dPoint prev_end = prev_trim.PointAtEnd(); //prev_c2->PointAt( prev_trim.m_t[1] );
              ON_3dPoint this_start = trim.PointAtStart(); //c2->PointAt( trim.m_t[0] );
              ON_3dPoint this_end = trim.PointAtEnd(); // c2->PointAt( trim.m_t[1] );
              ON_3dPoint next_start = next_trim.PointAtStart(); //prev_c2->PointAt( next_trim.m_t[0] );
              for ( dir = 0; dir < 2; dir++ )
              {
                if ( trim.m_tolerance[dir] < 0.0 || !bLazy )
                {
                  ds = fabs(prev_end[dir] - this_start[dir] );
                  de = fabs(this_end[dir] - next_start[dir] );
                  d = (ds >= de) ? ds : de;
                  trim.m_tolerance[dir] = ( d > ON_ZERO_TOLERANCE ) ? 1.001*d : 0.0;
                }
              }
            }
          }
          break;
        }
      }
    }
  }
  return (trim.m_tolerance[0] >= 0.0 && trim.m_tolerance[1] >= 0.0) ? true : false;
}